

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O2

uint32_t __thiscall
icu_63::CollationDataBuilder::encodeCEs
          (CollationDataBuilder *this,int64_t *ces,int32_t cesLength,UErrorCode *errorCode)

{
  UBool UVar1;
  uint32_t uVar2;
  ulong uVar3;
  int32_t newCE32s [31];
  uint32_t local_b8 [34];
  
  uVar2 = 0;
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    uVar2 = 0;
    if ((uint)cesLength < 0x20) {
      if ((this->trie == (UTrie2 *)0x0) || (UVar1 = utrie2_isFrozen_63(this->trie), UVar1 != '\0'))
      {
        *errorCode = U_INVALID_STATE_ERROR;
      }
      else if (cesLength == 0) {
        uVar2 = 0;
      }
      else {
        if (cesLength == 2) {
          uVar3 = *ces;
          if (((uVar3 & 0xffffffffff00ff) == 0x5000000) &&
             (uVar3 >> 0x20 != 0 && (ces[1] & 0xffffffff00ffffffU) == 0x500)) {
            return (int)((ulong)ces[1] >> 0x10) + ((int)uVar3 << 8 | (uint)(uVar3 >> 0x20)) + 0xc4;
          }
        }
        else if (cesLength == 1) {
          uVar2 = encodeOneCE(this,*ces,errorCode);
          return uVar2;
        }
        for (uVar3 = 0; (uint)cesLength != uVar3; uVar3 = uVar3 + 1) {
          uVar2 = encodeOneCEAsCE32(ces[uVar3]);
          if (uVar2 == 1) {
            uVar2 = encodeExpansion(this,ces,cesLength,errorCode);
            return uVar2;
          }
          local_b8[uVar3] = uVar2;
        }
        uVar2 = encodeExpansion32(this,(int32_t *)local_b8,cesLength,errorCode);
      }
    }
    else {
      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
  }
  return uVar2;
}

Assistant:

uint32_t
CollationDataBuilder::encodeCEs(const int64_t ces[], int32_t cesLength,
                                UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return 0; }
    if(cesLength < 0 || cesLength > Collation::MAX_EXPANSION_LENGTH) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    if(trie == NULL || utrie2_isFrozen(trie)) {
        errorCode = U_INVALID_STATE_ERROR;
        return 0;
    }
    if(cesLength == 0) {
        // Convenience: We cannot map to nothing, but we can map to a completely ignorable CE.
        // Do this here so that callers need not do it.
        return encodeOneCEAsCE32(0);
    } else if(cesLength == 1) {
        return encodeOneCE(ces[0], errorCode);
    } else if(cesLength == 2) {
        // Try to encode two CEs as one CE32.
        int64_t ce0 = ces[0];
        int64_t ce1 = ces[1];
        uint32_t p0 = (uint32_t)(ce0 >> 32);
        if((ce0 & INT64_C(0xffffffffff00ff)) == Collation::COMMON_SECONDARY_CE &&
                (ce1 & INT64_C(0xffffffff00ffffff)) == Collation::COMMON_TERTIARY_CE &&
                p0 != 0) {
            // Latin mini expansion
            return
                p0 |
                (((uint32_t)ce0 & 0xff00u) << 8) |
                (uint32_t)(ce1 >> 16) |
                Collation::SPECIAL_CE32_LOW_BYTE |
                Collation::LATIN_EXPANSION_TAG;
        }
    }
    // Try to encode two or more CEs as CE32s.
    int32_t newCE32s[Collation::MAX_EXPANSION_LENGTH];
    for(int32_t i = 0;; ++i) {
        if(i == cesLength) {
            return encodeExpansion32(newCE32s, cesLength, errorCode);
        }
        uint32_t ce32 = encodeOneCEAsCE32(ces[i]);
        if(ce32 == Collation::NO_CE32) { break; }
        newCE32s[i] = (int32_t)ce32;
    }
    return encodeExpansion(ces, cesLength, errorCode);
}